

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

FlagBase * __thiscall args::HelpFlag::Match(HelpFlag *this,string *arg)

{
  FlagBase *pFVar1;
  Help *this_00;
  
  pFVar1 = FlagBase::Match((FlagBase *)this,arg);
  if (pFVar1 == (FlagBase *)0x0) {
    return (FlagBase *)0x0;
  }
  this_00 = (Help *)__cxa_allocate_exception(0x10);
  Help::Help(this_00,arg);
  __cxa_throw(this_00,&Help::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual FlagBase *Match(const std::string &arg) override
            {
                if (FlagBase::Match(arg))
                {
#ifdef ARGS_NOEXCEPT
                    error = Error::Help;
                    return this;
#else
                    throw Help(arg);
#endif
                }
                return nullptr;
            }